

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::QuadMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  vfloat<4> vVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  BVH *bvh;
  size_t sVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  vbool<4> vVar42;
  bool bVar43;
  uint uVar44;
  undefined4 uVar45;
  int iVar46;
  AABBNodeMB4D *node1;
  ulong uVar47;
  ulong uVar48;
  long lVar49;
  ulong uVar50;
  ulong uVar51;
  long lVar52;
  size_t i;
  long lVar53;
  NodeRef root;
  size_t sVar54;
  long lVar55;
  long lVar56;
  uint uVar57;
  ulong uVar58;
  QuadMesh *mesh_4;
  NodeRef *pNVar59;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar60;
  float fVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar80;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar78;
  float fVar79;
  undefined1 in_ZMM0 [64];
  float fVar96;
  undefined1 auVar81 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar82;
  float fVar97;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [64];
  vint4 ai_2;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar119;
  vint4 bi_1;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar120;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar121;
  float fVar130;
  float fVar131;
  vint4 bi_3;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar132;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  vint4 bi;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar144;
  float fVar151;
  float fVar152;
  vint4 bi_2;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar153;
  undefined1 auVar150 [16];
  float fVar154;
  float fVar155;
  float fVar160;
  float fVar162;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar161;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar159 [16];
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  uint uVar178;
  uint uVar179;
  uint uVar180;
  float fVar181;
  float fVar184;
  float fVar185;
  vint4 ai;
  undefined1 auVar182 [16];
  float fVar186;
  undefined1 auVar183 [16];
  float fVar187;
  float fVar191;
  float fVar192;
  vint4 ai_1;
  undefined1 auVar188 [16];
  float fVar193;
  uint uVar194;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar195;
  float fVar202;
  float fVar203;
  vint4 ai_3;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar204;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 local_1aa8 [16];
  Vec3<embree::vfloat_impl<4>_> p1;
  Precalculations pre;
  QuadMesh *mesh;
  undefined1 local_1a08 [16];
  undefined1 local_19e8 [16];
  RayK<4> *local_19d8;
  uint local_19cc;
  undefined1 local_19c8 [16];
  Vec3<embree::vfloat_impl<4>_> p0;
  undefined1 local_1928 [16];
  vbool<4> terminated;
  float local_18e8;
  float fStack_18e4;
  float fStack_18e0;
  float fStack_18dc;
  vint<4> itime;
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  vfloat<4> t;
  vfloat<4> v;
  vfloat<4> u;
  float local_1838;
  float fStack_1834;
  float fStack_1830;
  float fStack_182c;
  float local_1828;
  float fStack_1824;
  float fStack_1820;
  float fStack_181c;
  TravRayK<4,_false> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar24 = mm_lookupmask_ps._248_8_;
  uVar23 = mm_lookupmask_ps._240_8_;
  uVar22 = mm_lookupmask_ps._8_8_;
  uVar21 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    auVar76 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar83 = vpcmpeqd_avx(auVar76,(undefined1  [16])valid_i->field_0);
    auVar81 = ZEXT816(0) << 0x40;
    auVar8 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar81,5);
    auVar75 = auVar83 & auVar8;
    if ((((auVar75 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar75 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar75 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar75[0xf] < '\0')
    {
      auVar8 = vandps_avx(auVar8,auVar83);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar174._8_4_ = 0x7fffffff;
      auVar174._0_8_ = 0x7fffffff7fffffff;
      auVar174._12_4_ = 0x7fffffff;
      auVar83 = vandps_avx(auVar174,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar156._8_4_ = 0x219392ef;
      auVar156._0_8_ = 0x219392ef219392ef;
      auVar156._12_4_ = 0x219392ef;
      auVar83 = vcmpps_avx(auVar83,auVar156,1);
      auVar75 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar156,auVar83)
      ;
      auVar83 = vandps_avx(auVar174,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar83 = vcmpps_avx(auVar83,auVar156,1);
      auVar123 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar156,auVar83
                              );
      auVar83 = vandps_avx(auVar174,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar83 = vcmpps_avx(auVar83,auVar156,1);
      auVar83 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar156,auVar83)
      ;
      auVar122 = vrcpps_avx(auVar75);
      fVar78 = auVar122._0_4_;
      auVar109._0_4_ = auVar75._0_4_ * fVar78;
      fVar79 = auVar122._4_4_;
      auVar109._4_4_ = auVar75._4_4_ * fVar79;
      fVar80 = auVar122._8_4_;
      auVar109._8_4_ = auVar75._8_4_ * fVar80;
      fVar96 = auVar122._12_4_;
      auVar109._12_4_ = auVar75._12_4_ * fVar96;
      auVar157._8_4_ = 0x3f800000;
      auVar157._0_8_ = 0x3f8000003f800000;
      auVar157._12_4_ = 0x3f800000;
      auVar75 = vsubps_avx(auVar157,auVar109);
      tray.rdir.field_0._0_4_ = fVar78 + fVar78 * auVar75._0_4_;
      tray.rdir.field_0._4_4_ = fVar79 + fVar79 * auVar75._4_4_;
      tray.rdir.field_0._8_4_ = fVar80 + fVar80 * auVar75._8_4_;
      tray.rdir.field_0._12_4_ = fVar96 + fVar96 * auVar75._12_4_;
      auVar75 = vrcpps_avx(auVar123);
      fVar78 = auVar75._0_4_;
      auVar122._0_4_ = auVar123._0_4_ * fVar78;
      fVar79 = auVar75._4_4_;
      auVar122._4_4_ = auVar123._4_4_ * fVar79;
      fVar80 = auVar75._8_4_;
      auVar122._8_4_ = auVar123._8_4_ * fVar80;
      fVar96 = auVar75._12_4_;
      auVar122._12_4_ = auVar123._12_4_ * fVar96;
      auVar75 = vsubps_avx(auVar157,auVar122);
      tray.rdir.field_0._16_4_ = fVar78 + fVar78 * auVar75._0_4_;
      tray.rdir.field_0._20_4_ = fVar79 + fVar79 * auVar75._4_4_;
      tray.rdir.field_0._24_4_ = fVar80 + fVar80 * auVar75._8_4_;
      tray.rdir.field_0._28_4_ = fVar96 + fVar96 * auVar75._12_4_;
      auVar75 = vrcpps_avx(auVar83);
      fVar78 = auVar75._0_4_;
      auVar133._0_4_ = auVar83._0_4_ * fVar78;
      fVar79 = auVar75._4_4_;
      auVar133._4_4_ = auVar83._4_4_ * fVar79;
      fVar80 = auVar75._8_4_;
      auVar133._8_4_ = auVar83._8_4_ * fVar80;
      fVar96 = auVar75._12_4_;
      auVar133._12_4_ = auVar83._12_4_ * fVar96;
      auVar83 = vsubps_avx(auVar157,auVar133);
      tray.rdir.field_0._32_4_ = fVar78 + fVar78 * auVar83._0_4_;
      tray.rdir.field_0._36_4_ = fVar79 + fVar79 * auVar83._4_4_;
      tray.rdir.field_0._40_4_ = fVar80 + fVar80 * auVar83._8_4_;
      tray.rdir.field_0._44_4_ = fVar96 + fVar96 * auVar83._12_4_;
      auVar83 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar81,1);
      auVar145._8_4_ = 0x10;
      auVar145._0_8_ = 0x1000000010;
      auVar145._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar83,auVar145);
      auVar83 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar81,5);
      auVar75._8_4_ = 0x20;
      auVar75._0_8_ = 0x2000000020;
      auVar75._12_4_ = 0x20;
      auVar146._8_4_ = 0x30;
      auVar146._0_8_ = 0x3000000030;
      auVar146._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar146,auVar75,auVar83)
      ;
      auVar83 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar81,5);
      auVar123._8_4_ = 0x40;
      auVar123._0_8_ = 0x4000000040;
      auVar123._12_4_ = 0x40;
      auVar134._8_4_ = 0x50;
      auVar134._0_8_ = 0x5000000050;
      auVar134._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar134,auVar123,auVar83);
      auVar83 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar81);
      auVar75 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar81);
      auVar81._8_4_ = 0x7f800000;
      auVar81._0_8_ = 0x7f8000007f800000;
      auVar81._12_4_ = 0x7f800000;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar81,auVar83,auVar8);
      auVar83._8_4_ = 0xff800000;
      auVar83._0_8_ = 0xff800000ff800000;
      auVar83._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar83,auVar75,auVar8);
      terminated.field_0.i[1] = auVar8._4_4_ ^ auVar76._4_4_;
      terminated.field_0.i[0] = auVar8._0_4_ ^ auVar76._0_4_;
      terminated.field_0.i[2] = auVar8._8_4_ ^ auVar76._8_4_;
      terminated.field_0.i[3] = auVar8._12_4_ ^ auVar76._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar57 = 3;
      }
      else {
        uVar57 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_19d8 = ray + 0x80;
      pNVar59 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar60 = &stack_near[2].field_0;
      stack_near[0].field_0.i[0] = 0x7f800000;
      stack_near[0].field_0.i[1] = 0x7f800000;
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
LAB_00ec3478:
      do {
        do {
          root.ptr = pNVar59[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_00ec4b1b;
          pNVar59 = pNVar59 + -1;
          paVar60 = paVar60 + -1;
          vVar1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar60->v;
          auVar95 = ZEXT1664((undefined1  [16])vVar1.field_0);
          auVar76 = vcmpps_avx((undefined1  [16])vVar1.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar44 = vmovmskps_avx(auVar76);
        } while (uVar44 == 0);
        uVar47 = (ulong)(uVar44 & 0xff);
        uVar44 = POPCOUNT(uVar44 & 0xff);
        if (uVar57 < uVar44) {
LAB_00ec34b7:
          do {
            vVar42.field_0 = terminated.field_0;
            lVar52 = -0x10;
            sVar54 = 8;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00ec4b1b;
              auVar76 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar95._0_16_,6);
              if ((((auVar76 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar76 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar76 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar76[0xf]) goto LAB_00ec3478;
              local_1928._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
              local_1928._8_4_ = terminated.field_0.i[2] ^ 0xffffffff;
              local_1928._12_4_ = terminated.field_0.i[3] ^ 0xffffffff;
              lVar52 = 0;
              goto LAB_00ec3777;
            }
            uVar47 = root.ptr & 0xfffffffffffffff0;
            auVar76 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar95._0_16_,6);
            auVar95 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            for (; (aVar82 = auVar95._0_16_, lVar52 != 0 &&
                   (sVar5 = *(size_t *)(uVar47 + 0x20 + lVar52 * 2), sVar5 != 8));
                lVar52 = lVar52 + 4) {
              fVar78 = *(float *)(uVar47 + 0x90 + lVar52);
              fVar79 = *(float *)(uVar47 + 0x30 + lVar52);
              auVar83 = *(undefined1 (*) [16])(ray + 0x70);
              fVar80 = auVar83._0_4_;
              fVar96 = auVar83._4_4_;
              fVar61 = auVar83._8_4_;
              fVar97 = auVar83._12_4_;
              auVar98._0_4_ = fVar80 * fVar78 + fVar79;
              auVar98._4_4_ = fVar96 * fVar78 + fVar79;
              auVar98._8_4_ = fVar61 * fVar78 + fVar79;
              auVar98._12_4_ = fVar97 * fVar78 + fVar79;
              fVar78 = *(float *)(uVar47 + 0xb0 + lVar52);
              fVar79 = *(float *)(uVar47 + 0x50 + lVar52);
              auVar110._0_4_ = fVar80 * fVar78 + fVar79;
              auVar110._4_4_ = fVar96 * fVar78 + fVar79;
              auVar110._8_4_ = fVar61 * fVar78 + fVar79;
              auVar110._12_4_ = fVar97 * fVar78 + fVar79;
              fVar78 = *(float *)(uVar47 + 0xd0 + lVar52);
              fVar79 = *(float *)(uVar47 + 0x70 + lVar52);
              auVar124._0_4_ = fVar80 * fVar78 + fVar79;
              auVar124._4_4_ = fVar96 * fVar78 + fVar79;
              auVar124._8_4_ = fVar61 * fVar78 + fVar79;
              auVar124._12_4_ = fVar97 * fVar78 + fVar79;
              fVar78 = *(float *)(uVar47 + 0xa0 + lVar52);
              fVar79 = *(float *)(uVar47 + 0x40 + lVar52);
              auVar135._0_4_ = fVar80 * fVar78 + fVar79;
              auVar135._4_4_ = fVar96 * fVar78 + fVar79;
              auVar135._8_4_ = fVar61 * fVar78 + fVar79;
              auVar135._12_4_ = fVar97 * fVar78 + fVar79;
              fVar78 = *(float *)(uVar47 + 0xc0 + lVar52);
              fVar79 = *(float *)(uVar47 + 0x60 + lVar52);
              auVar147._0_4_ = fVar80 * fVar78 + fVar79;
              auVar147._4_4_ = fVar96 * fVar78 + fVar79;
              auVar147._8_4_ = fVar61 * fVar78 + fVar79;
              auVar147._12_4_ = fVar97 * fVar78 + fVar79;
              fVar78 = *(float *)(uVar47 + 0xe0 + lVar52);
              fVar79 = *(float *)(uVar47 + 0x80 + lVar52);
              auVar158._0_4_ = fVar79 + fVar80 * fVar78;
              auVar158._4_4_ = fVar79 + fVar96 * fVar78;
              auVar158._8_4_ = fVar79 + fVar61 * fVar78;
              auVar158._12_4_ = fVar79 + fVar97 * fVar78;
              auVar16._8_8_ = tray.org.field_0._8_8_;
              auVar16._0_8_ = tray.org.field_0._0_8_;
              auVar17._8_8_ = tray.org.field_0._24_8_;
              auVar17._0_8_ = tray.org.field_0._16_8_;
              auVar18._8_8_ = tray.org.field_0._40_8_;
              auVar18._0_8_ = tray.org.field_0._32_8_;
              auVar75 = vsubps_avx(auVar98,auVar16);
              auVar182._0_4_ = tray.rdir.field_0._0_4_ * auVar75._0_4_;
              auVar182._4_4_ = tray.rdir.field_0._4_4_ * auVar75._4_4_;
              auVar182._8_4_ = tray.rdir.field_0._8_4_ * auVar75._8_4_;
              auVar182._12_4_ = tray.rdir.field_0._12_4_ * auVar75._12_4_;
              auVar75 = vsubps_avx(auVar110,auVar17);
              auVar188._0_4_ = auVar75._0_4_ * (float)tray.rdir.field_0._16_4_;
              auVar188._4_4_ = auVar75._4_4_ * (float)tray.rdir.field_0._20_4_;
              auVar188._8_4_ = auVar75._8_4_ * (float)tray.rdir.field_0._24_4_;
              auVar188._12_4_ = auVar75._12_4_ * (float)tray.rdir.field_0._28_4_;
              auVar75 = vsubps_avx(auVar124,auVar18);
              auVar196._0_4_ = auVar75._0_4_ * (float)tray.rdir.field_0._32_4_;
              auVar196._4_4_ = auVar75._4_4_ * (float)tray.rdir.field_0._36_4_;
              auVar196._8_4_ = auVar75._8_4_ * (float)tray.rdir.field_0._40_4_;
              auVar196._12_4_ = auVar75._12_4_ * (float)tray.rdir.field_0._44_4_;
              auVar75 = vsubps_avx(auVar135,auVar16);
              auVar136._0_4_ = tray.rdir.field_0._0_4_ * auVar75._0_4_;
              auVar136._4_4_ = tray.rdir.field_0._4_4_ * auVar75._4_4_;
              auVar136._8_4_ = tray.rdir.field_0._8_4_ * auVar75._8_4_;
              auVar136._12_4_ = tray.rdir.field_0._12_4_ * auVar75._12_4_;
              auVar75 = vsubps_avx(auVar147,auVar17);
              auVar111._0_4_ = auVar75._0_4_ * (float)tray.rdir.field_0._16_4_;
              auVar111._4_4_ = auVar75._4_4_ * (float)tray.rdir.field_0._20_4_;
              auVar111._8_4_ = auVar75._8_4_ * (float)tray.rdir.field_0._24_4_;
              auVar111._12_4_ = auVar75._12_4_ * (float)tray.rdir.field_0._28_4_;
              auVar75 = vsubps_avx(auVar158,auVar18);
              auVar125._0_4_ = auVar75._0_4_ * (float)tray.rdir.field_0._32_4_;
              auVar125._4_4_ = auVar75._4_4_ * (float)tray.rdir.field_0._36_4_;
              auVar125._8_4_ = auVar75._8_4_ * (float)tray.rdir.field_0._40_4_;
              auVar125._12_4_ = auVar75._12_4_ * (float)tray.rdir.field_0._44_4_;
              auVar75 = vpminsd_avx(auVar182,auVar136);
              auVar81 = vpminsd_avx(auVar188,auVar111);
              auVar75 = vpmaxsd_avx(auVar75,auVar81);
              auVar81 = vpminsd_avx(auVar196,auVar125);
              auVar75 = vpmaxsd_avx(auVar75,auVar81);
              auVar81 = vpmaxsd_avx(auVar182,auVar136);
              auVar123 = vpmaxsd_avx(auVar188,auVar111);
              auVar122 = vpminsd_avx(auVar81,auVar123);
              auVar81 = vpmaxsd_avx(auVar196,auVar125);
              auVar123 = vpmaxsd_avx(auVar75,(undefined1  [16])tray.tnear.field_0);
              auVar81 = vpminsd_avx(auVar122,auVar81);
              auVar81 = vpminsd_avx(auVar81,(undefined1  [16])tray.tfar.field_0);
              if (((uint)root.ptr & 7) == 6) {
                auVar81 = vcmpps_avx(auVar123,auVar81,2);
                uVar45 = *(undefined4 *)(uVar47 + 0xf0 + lVar52);
                auVar126._4_4_ = uVar45;
                auVar126._0_4_ = uVar45;
                auVar126._8_4_ = uVar45;
                auVar126._12_4_ = uVar45;
                auVar123 = vcmpps_avx(auVar126,auVar83,2);
                uVar45 = *(undefined4 *)(uVar47 + 0x100 + lVar52);
                auVar137._4_4_ = uVar45;
                auVar137._0_4_ = uVar45;
                auVar137._8_4_ = uVar45;
                auVar137._12_4_ = uVar45;
                auVar83 = vcmpps_avx(auVar83,auVar137,1);
                auVar83 = vandps_avx(auVar123,auVar83);
                auVar83 = vandps_avx(auVar83,auVar81);
              }
              else {
                auVar83 = vcmpps_avx(auVar123,auVar81,2);
              }
              auVar83 = vandps_avx(auVar83,auVar76);
              auVar83 = vpslld_avx(auVar83,0x1f);
              if ((((auVar83 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar83 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar83 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar83[0xf]) {
                auVar95 = ZEXT1664((undefined1  [16])aVar82);
                sVar5 = sVar54;
              }
              else {
                auVar112._8_4_ = 0x7f800000;
                auVar112._0_8_ = 0x7f8000007f800000;
                auVar112._12_4_ = 0x7f800000;
                auVar83 = vblendvps_avx(auVar112,auVar75,auVar83);
                auVar95 = ZEXT1664(auVar83);
                if (sVar54 != 8) {
                  pNVar59->ptr = sVar54;
                  pNVar59 = pNVar59 + 1;
                  *paVar60 = aVar82;
                  paVar60 = paVar60 + 1;
                }
              }
              sVar54 = sVar5;
            }
            if (sVar54 == 8) goto LAB_00ec3711;
            auVar76 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar82,6);
            uVar45 = vmovmskps_avx(auVar76);
            root.ptr = sVar54;
          } while ((byte)uVar57 < (byte)POPCOUNT(uVar45));
          pNVar59->ptr = sVar54;
          pNVar59 = pNVar59 + 1;
          *paVar60 = aVar82;
          paVar60 = paVar60 + 1;
LAB_00ec3711:
          iVar46 = 4;
        }
        else {
          while (uVar47 != 0) {
            sVar54 = 0;
            if (uVar47 != 0) {
              for (; (uVar47 >> sVar54 & 1) == 0; sVar54 = sVar54 + 1) {
              }
            }
            uVar47 = uVar47 & uVar47 - 1;
            bVar43 = occluded1(This,bvh,root,sVar54,&pre,ray,&tray,context);
            if (bVar43) {
              terminated.field_0.i[sVar54] = -1;
            }
          }
          auVar76 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
          iVar46 = 3;
          if ((((auVar76 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar76 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar76 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar76[0xf] < '\0') {
            auVar76._8_4_ = 0xff800000;
            auVar76._0_8_ = 0xff800000ff800000;
            auVar76._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar76,
                               (undefined1  [16])terminated.field_0);
            iVar46 = 2;
          }
          auVar95 = ZEXT1664((undefined1  [16])vVar1.field_0);
          if (uVar57 < uVar44) goto LAB_00ec34b7;
        }
      } while (iVar46 != 3);
LAB_00ec4b1b:
      auVar8 = vandps_avx(auVar8,(undefined1  [16])terminated.field_0);
      auVar94._8_4_ = 0xff800000;
      auVar94._0_8_ = 0xff800000ff800000;
      auVar94._12_4_ = 0xff800000;
      auVar8 = vmaskmovps_avx(auVar8,auVar94);
      *(undefined1 (*) [16])local_19d8 = auVar8;
    }
  }
  return;
LAB_00ec3777:
  do {
    auVar76 = auVar95._0_16_;
    if (lVar52 == (ulong)((uint)root.ptr & 0xf) - 8) break;
    lVar55 = lVar52 * 0x60 + (root.ptr & 0xfffffffffffffff0);
    auVar95 = ZEXT1664(local_1928);
    uVar45 = vmovmskps_avx(local_1928);
    uVar47 = CONCAT44((int)((ulong)lVar52 >> 0x20),uVar45);
    lVar53 = 0;
    do {
      auVar83 = auVar95._0_16_;
      if ((lVar53 == 4) || (uVar44 = *(uint *)(lVar55 + 0x50 + lVar53 * 4), uVar44 == 0xffffffff))
      break;
      uVar178 = *(uint *)(lVar55 + 0x40 + lVar53 * 4);
      pGVar6 = (context->scene->geometries).items[uVar178].ptr;
      fVar78 = (pGVar6->time_range).lower;
      auVar62._4_4_ = fVar78;
      auVar62._0_4_ = fVar78;
      auVar62._8_4_ = fVar78;
      auVar62._12_4_ = fVar78;
      fVar79 = pGVar6->fnumTimeSegments;
      auVar75 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar62);
      auVar76 = ZEXT416((uint)((pGVar6->time_range).upper - fVar78));
      auVar76 = vshufps_avx(auVar76,auVar76,0);
      auVar76 = vdivps_avx(auVar75,auVar76);
      auVar63._0_4_ = fVar79 * auVar76._0_4_;
      auVar63._4_4_ = fVar79 * auVar76._4_4_;
      auVar63._8_4_ = fVar79 * auVar76._8_4_;
      auVar63._12_4_ = fVar79 * auVar76._12_4_;
      auVar76 = vroundps_avx(auVar63,1);
      auVar75 = vshufps_avx(ZEXT416((uint)(fVar79 + -1.0)),ZEXT416((uint)(fVar79 + -1.0)),0);
      auVar76 = vminps_avx(auVar76,auVar75);
      auVar76 = vmaxps_avx(auVar76,_DAT_01f45a50);
      auVar75 = vsubps_avx(auVar63,auVar76);
      itime.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)vcvtps2dq_avx(auVar76);
      uVar48 = 0;
      if (uVar47 != 0) {
        for (; (uVar47 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
        }
      }
      auVar76 = vpshufd_avx(ZEXT416((uint)itime.field_0.i[uVar48]),0);
      auVar76 = vpcmpeqd_avx(auVar76,(undefined1  [16])itime.field_0);
      auVar76 = local_1928 & ~auVar76;
      fVar79 = auVar75._4_4_;
      fVar80 = auVar75._8_4_;
      fVar96 = auVar75._12_4_;
      fVar78 = auVar75._0_4_;
      uVar50 = uVar47;
      uVar51 = uVar48;
      local_19cc = uVar44;
      if ((((auVar76 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar76 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar76 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar76[0xf])
      {
        lVar49 = (long)itime.field_0.i[uVar48] * 0x38;
        lVar56 = *(long *)(*(long *)&pGVar6[2].numPrimitives + lVar49);
        lVar49 = *(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 + lVar49);
        uVar48 = (ulong)*(uint *)(lVar55 + lVar53 * 4);
        uVar51 = (ulong)*(uint *)(lVar55 + 0x10 + lVar53 * 4);
        fVar61 = *(float *)(lVar56 + uVar48 * 4);
        fVar97 = *(float *)(lVar56 + 4 + uVar48 * 4);
        fVar119 = *(float *)(lVar56 + 8 + uVar48 * 4);
        fVar120 = *(float *)(lVar49 + uVar48 * 4);
        fVar195 = *(float *)(lVar49 + 4 + uVar48 * 4);
        fVar202 = *(float *)(lVar49 + 8 + uVar48 * 4);
        auVar113._8_4_ = 0x3f800000;
        auVar113._0_8_ = 0x3f8000003f800000;
        auVar113._12_4_ = 0x3f800000;
        auVar76 = vsubps_avx(auVar113,auVar75);
        fVar203 = auVar76._0_4_;
        fVar204 = auVar76._4_4_;
        fVar155 = auVar76._8_4_;
        fVar161 = auVar76._12_4_;
        auVar99._0_4_ = fVar203 * fVar61 + fVar78 * fVar120;
        auVar99._4_4_ = fVar204 * fVar61 + fVar79 * fVar120;
        auVar99._8_4_ = fVar155 * fVar61 + fVar80 * fVar120;
        auVar99._12_4_ = fVar161 * fVar61 + fVar96 * fVar120;
        auVar127._0_4_ = fVar203 * fVar97 + fVar78 * fVar195;
        auVar127._4_4_ = fVar204 * fVar97 + fVar79 * fVar195;
        auVar127._8_4_ = fVar155 * fVar97 + fVar80 * fVar195;
        auVar127._12_4_ = fVar161 * fVar97 + fVar96 * fVar195;
        auVar197._0_4_ = fVar203 * fVar119 + fVar78 * fVar202;
        auVar197._4_4_ = fVar204 * fVar119 + fVar79 * fVar202;
        auVar197._8_4_ = fVar155 * fVar119 + fVar80 * fVar202;
        auVar197._12_4_ = fVar161 * fVar119 + fVar96 * fVar202;
        fVar61 = *(float *)(lVar56 + uVar51 * 4);
        fVar97 = *(float *)(lVar56 + 4 + uVar51 * 4);
        fVar119 = *(float *)(lVar56 + 8 + uVar51 * 4);
        fVar120 = *(float *)(lVar49 + uVar51 * 4);
        fVar195 = *(float *)(lVar49 + 4 + uVar51 * 4);
        fVar202 = *(float *)(lVar49 + 8 + uVar51 * 4);
        auVar205._0_4_ = fVar120 * fVar78 + fVar203 * fVar61;
        auVar205._4_4_ = fVar120 * fVar79 + fVar204 * fVar61;
        auVar205._8_4_ = fVar120 * fVar80 + fVar155 * fVar61;
        auVar205._12_4_ = fVar120 * fVar96 + fVar161 * fVar61;
        auVar84._0_4_ = fVar195 * fVar78 + fVar203 * fVar97;
        auVar84._4_4_ = fVar195 * fVar79 + fVar204 * fVar97;
        auVar84._8_4_ = fVar195 * fVar80 + fVar155 * fVar97;
        auVar84._12_4_ = fVar195 * fVar96 + fVar161 * fVar97;
        auVar159._0_4_ = fVar202 * fVar78 + fVar203 * fVar119;
        auVar159._4_4_ = fVar202 * fVar79 + fVar204 * fVar119;
        auVar159._8_4_ = fVar202 * fVar80 + fVar155 * fVar119;
        auVar159._12_4_ = fVar202 * fVar96 + fVar161 * fVar119;
        uVar48 = (ulong)*(uint *)(lVar55 + 0x20 + lVar53 * 4);
        fVar61 = *(float *)(lVar56 + uVar48 * 4);
        fVar97 = *(float *)(lVar56 + 4 + uVar48 * 4);
        fVar119 = *(float *)(lVar56 + 8 + uVar48 * 4);
        fVar120 = *(float *)(lVar49 + uVar48 * 4);
        fVar195 = *(float *)(lVar49 + 4 + uVar48 * 4);
        fVar202 = *(float *)(lVar49 + 8 + uVar48 * 4);
        local_1838 = fVar120 * fVar78 + fVar203 * fVar61;
        fStack_1834 = fVar120 * fVar79 + fVar204 * fVar61;
        fStack_1830 = fVar120 * fVar80 + fVar155 * fVar61;
        fStack_182c = fVar120 * fVar96 + fVar161 * fVar61;
        local_18e8 = fVar195 * fVar78 + fVar203 * fVar97;
        fStack_18e4 = fVar195 * fVar79 + fVar204 * fVar97;
        fStack_18e0 = fVar195 * fVar80 + fVar155 * fVar97;
        fStack_18dc = fVar195 * fVar96 + fVar161 * fVar97;
        local_1828 = fVar202 * fVar78 + fVar203 * fVar119;
        fStack_1824 = fVar202 * fVar79 + fVar204 * fVar119;
        fStack_1820 = fVar202 * fVar80 + fVar155 * fVar119;
        fStack_181c = fVar202 * fVar96 + fVar161 * fVar119;
        uVar48 = (ulong)*(uint *)(lVar55 + 0x30 + lVar53 * 4);
        fVar61 = *(float *)(lVar49 + uVar48 * 4);
        fVar97 = *(float *)(lVar49 + 4 + uVar48 * 4);
        fVar119 = *(float *)(lVar49 + 8 + uVar48 * 4);
        fVar120 = *(float *)(lVar56 + uVar48 * 4);
        auVar176._0_4_ = fVar203 * fVar120 + fVar78 * fVar61;
        auVar176._4_4_ = fVar204 * fVar120 + fVar79 * fVar61;
        auVar176._8_4_ = fVar155 * fVar120 + fVar80 * fVar61;
        auVar176._12_4_ = fVar161 * fVar120 + fVar96 * fVar61;
        fVar61 = *(float *)(lVar56 + 4 + uVar48 * 4);
        auVar148._0_4_ = fVar203 * fVar61 + fVar78 * fVar97;
        auVar148._4_4_ = fVar204 * fVar61 + fVar79 * fVar97;
        auVar148._8_4_ = fVar155 * fVar61 + fVar80 * fVar97;
        auVar148._12_4_ = fVar161 * fVar61 + fVar96 * fVar97;
        fVar61 = *(float *)(lVar56 + 8 + uVar48 * 4);
        auVar64._0_4_ = fVar203 * fVar61 + fVar78 * fVar119;
        auVar64._4_4_ = fVar204 * fVar61 + fVar79 * fVar119;
        auVar64._8_4_ = fVar155 * fVar61 + fVar80 * fVar119;
        auVar64._12_4_ = fVar161 * fVar61 + fVar96 * fVar119;
      }
      else {
        while (uVar50 != 0) {
          lVar56 = (long)itime.field_0.i[uVar51] * 0x38;
          uVar58 = (ulong)*(uint *)(lVar55 + lVar53 * 4);
          auVar76 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar6[2].numPrimitives + lVar56) + uVar58 * 4);
          auVar81 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 + lVar56) + uVar58 * 4);
          *(int *)((long)&p0.field_0 + uVar51 * 4) = auVar76._0_4_;
          uVar45 = vextractps_avx(auVar76,1);
          *(undefined4 *)((long)&p0.field_0 + uVar51 * 4 + 0x10) = uVar45;
          uVar45 = vextractps_avx(auVar76,2);
          *(undefined4 *)((long)&p0.field_0 + uVar51 * 4 + 0x20) = uVar45;
          *(int *)((long)&p1.field_0 + uVar51 * 4) = auVar81._0_4_;
          uVar45 = vextractps_avx(auVar81,1);
          *(undefined4 *)((long)&p1.field_0 + uVar51 * 4 + 0x10) = uVar45;
          uVar45 = vextractps_avx(auVar81,2);
          *(undefined4 *)((long)&p1.field_0 + uVar51 * 4 + 0x20) = uVar45;
          uVar50 = uVar50 ^ 1L << (uVar51 & 0x3f);
          uVar51 = 0;
          if (uVar50 != 0) {
            for (; (uVar50 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
            }
          }
        }
        auVar90._8_4_ = 0x3f800000;
        auVar90._0_8_ = 0x3f8000003f800000;
        auVar90._12_4_ = 0x3f800000;
        auVar76 = vsubps_avx(auVar90,auVar75);
        uVar28 = p0.field_0._0_4_;
        uVar29 = p0.field_0._4_4_;
        uVar30 = p0.field_0._8_4_;
        uVar31 = p0.field_0._12_4_;
        uVar32 = p0.field_0._32_4_;
        uVar33 = p0.field_0._36_4_;
        uVar36 = p0.field_0._40_4_;
        uVar39 = p0.field_0._44_4_;
        fVar61 = auVar76._0_4_;
        fVar97 = auVar76._4_4_;
        fVar119 = auVar76._8_4_;
        fVar120 = auVar76._12_4_;
        uVar45 = p1.field_0._0_4_;
        uVar25 = p1.field_0._4_4_;
        uVar26 = p1.field_0._8_4_;
        uVar27 = p1.field_0._12_4_;
        auVar127._0_4_ = fVar61 * (float)p0.field_0._16_4_ + fVar78 * (float)p1.field_0._16_4_;
        auVar127._4_4_ = fVar97 * (float)p0.field_0._20_4_ + fVar79 * (float)p1.field_0._20_4_;
        auVar127._8_4_ = fVar119 * (float)p0.field_0._24_4_ + fVar80 * (float)p1.field_0._24_4_;
        auVar127._12_4_ = fVar120 * (float)p0.field_0._28_4_ + fVar96 * (float)p1.field_0._28_4_;
        fVar195 = fVar78 * (float)p1.field_0._32_4_;
        fVar202 = fVar79 * (float)p1.field_0._36_4_;
        fVar203 = fVar80 * (float)p1.field_0._40_4_;
        fVar204 = fVar96 * (float)p1.field_0._44_4_;
        uVar50 = uVar47;
        uVar51 = uVar48;
        while (uVar50 != 0) {
          lVar56 = (long)itime.field_0.i[uVar51] * 0x38;
          uVar58 = (ulong)*(uint *)(lVar55 + 0x10 + lVar53 * 4);
          auVar76 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar6[2].numPrimitives + lVar56) + uVar58 * 4);
          auVar75 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 + lVar56) + uVar58 * 4);
          *(int *)((long)&p0.field_0 + uVar51 * 4) = auVar76._0_4_;
          uVar2 = vextractps_avx(auVar76,1);
          *(undefined4 *)((long)&p0.field_0 + uVar51 * 4 + 0x10) = uVar2;
          uVar2 = vextractps_avx(auVar76,2);
          *(undefined4 *)((long)&p0.field_0 + uVar51 * 4 + 0x20) = uVar2;
          *(int *)((long)&p1.field_0 + uVar51 * 4) = auVar75._0_4_;
          uVar2 = vextractps_avx(auVar75,1);
          *(undefined4 *)((long)&p1.field_0 + uVar51 * 4 + 0x10) = uVar2;
          uVar2 = vextractps_avx(auVar75,2);
          *(undefined4 *)((long)&p1.field_0 + uVar51 * 4 + 0x20) = uVar2;
          uVar50 = uVar50 ^ 1L << (uVar51 & 0x3f);
          uVar51 = 0;
          if (uVar50 != 0) {
            for (; (uVar50 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
            }
          }
        }
        auVar99._0_4_ = fVar61 * (float)uVar28 + fVar78 * (float)uVar45;
        auVar99._4_4_ = fVar97 * (float)uVar29 + fVar79 * (float)uVar25;
        auVar99._8_4_ = fVar119 * (float)uVar30 + fVar80 * (float)uVar26;
        auVar99._12_4_ = fVar120 * (float)uVar31 + fVar96 * (float)uVar27;
        uVar28 = p0.field_0._0_4_;
        uVar29 = p0.field_0._4_4_;
        uVar30 = p0.field_0._8_4_;
        uVar31 = p0.field_0._12_4_;
        uVar2 = p0.field_0._32_4_;
        uVar34 = p0.field_0._36_4_;
        uVar37 = p0.field_0._40_4_;
        uVar40 = p0.field_0._44_4_;
        uVar45 = p1.field_0._0_4_;
        uVar25 = p1.field_0._4_4_;
        uVar26 = p1.field_0._8_4_;
        uVar27 = p1.field_0._12_4_;
        auVar84._0_4_ = fVar78 * (float)p1.field_0._16_4_ + fVar61 * (float)p0.field_0._16_4_;
        auVar84._4_4_ = fVar79 * (float)p1.field_0._20_4_ + fVar97 * (float)p0.field_0._20_4_;
        auVar84._8_4_ = fVar80 * (float)p1.field_0._24_4_ + fVar119 * (float)p0.field_0._24_4_;
        auVar84._12_4_ = fVar96 * (float)p1.field_0._28_4_ + fVar120 * (float)p0.field_0._28_4_;
        fVar155 = fVar78 * (float)p1.field_0._32_4_;
        fVar161 = fVar79 * (float)p1.field_0._36_4_;
        fVar163 = fVar80 * (float)p1.field_0._40_4_;
        fVar165 = fVar96 * (float)p1.field_0._44_4_;
        uVar50 = uVar47;
        uVar51 = uVar48;
        while (uVar50 != 0) {
          lVar56 = (long)itime.field_0.i[uVar51] * 0x38;
          uVar58 = (ulong)*(uint *)(lVar55 + 0x20 + lVar53 * 4);
          auVar76 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar6[2].numPrimitives + lVar56) + uVar58 * 4);
          auVar75 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 + lVar56) + uVar58 * 4);
          *(int *)((long)&p0.field_0 + uVar51 * 4) = auVar76._0_4_;
          uVar3 = vextractps_avx(auVar76,1);
          *(undefined4 *)((long)&p0.field_0 + uVar51 * 4 + 0x10) = uVar3;
          uVar3 = vextractps_avx(auVar76,2);
          *(undefined4 *)((long)&p0.field_0 + uVar51 * 4 + 0x20) = uVar3;
          *(int *)((long)&p1.field_0 + uVar51 * 4) = auVar75._0_4_;
          uVar3 = vextractps_avx(auVar75,1);
          *(undefined4 *)((long)&p1.field_0 + uVar51 * 4 + 0x10) = uVar3;
          uVar3 = vextractps_avx(auVar75,2);
          *(undefined4 *)((long)&p1.field_0 + uVar51 * 4 + 0x20) = uVar3;
          uVar50 = uVar50 ^ 1L << (uVar51 & 0x3f);
          uVar51 = 0;
          if (uVar50 != 0) {
            for (; (uVar50 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
            }
          }
        }
        auVar205._0_4_ = (float)uVar28 * fVar61 + (float)uVar45 * fVar78;
        auVar205._4_4_ = (float)uVar29 * fVar97 + (float)uVar25 * fVar79;
        auVar205._8_4_ = (float)uVar30 * fVar119 + (float)uVar26 * fVar80;
        auVar205._12_4_ = (float)uVar31 * fVar120 + (float)uVar27 * fVar96;
        uVar28 = p0.field_0._0_4_;
        uVar29 = p0.field_0._4_4_;
        uVar30 = p0.field_0._8_4_;
        uVar31 = p0.field_0._12_4_;
        uVar3 = p0.field_0._32_4_;
        uVar35 = p0.field_0._36_4_;
        uVar38 = p0.field_0._40_4_;
        uVar41 = p0.field_0._44_4_;
        uVar45 = p1.field_0._0_4_;
        uVar25 = p1.field_0._4_4_;
        uVar26 = p1.field_0._8_4_;
        uVar27 = p1.field_0._12_4_;
        local_18e8 = fVar61 * (float)p0.field_0._16_4_ + fVar78 * (float)p1.field_0._16_4_;
        fStack_18e4 = fVar97 * (float)p0.field_0._20_4_ + fVar79 * (float)p1.field_0._20_4_;
        fStack_18e0 = fVar119 * (float)p0.field_0._24_4_ + fVar80 * (float)p1.field_0._24_4_;
        fStack_18dc = fVar120 * (float)p0.field_0._28_4_ + fVar96 * (float)p1.field_0._28_4_;
        local_1828 = fVar78 * (float)p1.field_0._32_4_;
        fStack_1824 = fVar79 * (float)p1.field_0._36_4_;
        fStack_1820 = fVar80 * (float)p1.field_0._40_4_;
        fStack_181c = fVar96 * (float)p1.field_0._44_4_;
        uVar51 = uVar47;
        while (uVar51 != 0) {
          lVar56 = (long)itime.field_0.i[uVar48] * 0x38;
          uVar50 = (ulong)*(uint *)(lVar55 + 0x30 + lVar53 * 4);
          auVar76 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar6[2].numPrimitives + lVar56) + uVar50 * 4);
          auVar75 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 + lVar56) + uVar50 * 4);
          *(int *)((long)&p0.field_0 + uVar48 * 4) = auVar76._0_4_;
          uVar4 = vextractps_avx(auVar76,1);
          *(undefined4 *)((long)&p0.field_0 + uVar48 * 4 + 0x10) = uVar4;
          uVar4 = vextractps_avx(auVar76,2);
          *(undefined4 *)((long)&p0.field_0 + uVar48 * 4 + 0x20) = uVar4;
          *(int *)((long)&p1.field_0 + uVar48 * 4) = auVar75._0_4_;
          uVar4 = vextractps_avx(auVar75,1);
          *(undefined4 *)((long)&p1.field_0 + uVar48 * 4 + 0x10) = uVar4;
          uVar4 = vextractps_avx(auVar75,2);
          *(undefined4 *)((long)&p1.field_0 + uVar48 * 4 + 0x20) = uVar4;
          uVar51 = uVar51 ^ 1L << (uVar48 & 0x3f);
          uVar48 = 0;
          if (uVar51 != 0) {
            for (; (uVar51 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
            }
          }
        }
        auVar197._0_4_ = fVar195 + fVar61 * (float)uVar32;
        auVar197._4_4_ = fVar202 + fVar97 * (float)uVar33;
        auVar197._8_4_ = fVar203 + fVar119 * (float)uVar36;
        auVar197._12_4_ = fVar204 + fVar120 * (float)uVar39;
        auVar159._0_4_ = fVar61 * (float)uVar2 + fVar155;
        auVar159._4_4_ = fVar97 * (float)uVar34 + fVar161;
        auVar159._8_4_ = fVar119 * (float)uVar37 + fVar163;
        auVar159._12_4_ = fVar120 * (float)uVar40 + fVar165;
        local_1828 = local_1828 + (float)uVar3 * fVar61;
        fStack_1824 = fStack_1824 + (float)uVar35 * fVar97;
        fStack_1820 = fStack_1820 + (float)uVar38 * fVar119;
        fStack_181c = fStack_181c + (float)uVar41 * fVar120;
        local_1838 = (float)uVar28 * fVar61 + (float)uVar45 * fVar78;
        fStack_1834 = (float)uVar29 * fVar97 + (float)uVar25 * fVar79;
        fStack_1830 = (float)uVar30 * fVar119 + (float)uVar26 * fVar80;
        fStack_182c = (float)uVar31 * fVar120 + (float)uVar27 * fVar96;
        auVar176._0_4_ = fVar78 * (float)p1.field_0._0_4_ + fVar61 * (float)p0.field_0._0_4_;
        auVar176._4_4_ = fVar79 * (float)p1.field_0._4_4_ + fVar97 * (float)p0.field_0._4_4_;
        auVar176._8_4_ = fVar80 * (float)p1.field_0._8_4_ + fVar119 * (float)p0.field_0._8_4_;
        auVar176._12_4_ = fVar96 * (float)p1.field_0._12_4_ + fVar120 * (float)p0.field_0._12_4_;
        auVar148._0_4_ = fVar61 * (float)p0.field_0._16_4_ + fVar78 * (float)p1.field_0._16_4_;
        auVar148._4_4_ = fVar97 * (float)p0.field_0._20_4_ + fVar79 * (float)p1.field_0._20_4_;
        auVar148._8_4_ = fVar119 * (float)p0.field_0._24_4_ + fVar80 * (float)p1.field_0._24_4_;
        auVar148._12_4_ = fVar120 * (float)p0.field_0._28_4_ + fVar96 * (float)p1.field_0._28_4_;
        auVar64._0_4_ = fVar61 * (float)p0.field_0._32_4_ + fVar78 * (float)p1.field_0._32_4_;
        auVar64._4_4_ = fVar97 * (float)p0.field_0._36_4_ + fVar79 * (float)p1.field_0._36_4_;
        auVar64._8_4_ = fVar119 * (float)p0.field_0._40_4_ + fVar80 * (float)p1.field_0._40_4_;
        auVar64._12_4_ = fVar120 * (float)p0.field_0._44_4_ + fVar96 * (float)p1.field_0._44_4_;
      }
      auVar76 = vsubps_avx(auVar99,auVar205);
      auVar75 = vsubps_avx(auVar127,auVar84);
      auVar81 = vsubps_avx(auVar197,auVar159);
      auVar123 = vsubps_avx(auVar176,auVar99);
      auVar122 = vsubps_avx(auVar148,auVar127);
      auVar109 = vsubps_avx(auVar64,auVar197);
      fVar78 = auVar109._0_4_;
      fVar166 = auVar75._0_4_;
      auVar65._0_4_ = fVar166 * fVar78;
      fVar80 = auVar109._4_4_;
      fVar168 = auVar75._4_4_;
      auVar65._4_4_ = fVar168 * fVar80;
      fVar61 = auVar109._8_4_;
      fVar170 = auVar75._8_4_;
      auVar65._8_4_ = fVar170 * fVar61;
      fVar119 = auVar109._12_4_;
      fVar172 = auVar75._12_4_;
      auVar65._12_4_ = fVar172 * fVar119;
      fVar79 = auVar81._0_4_;
      fVar187 = auVar122._0_4_;
      auVar114._0_4_ = fVar187 * fVar79;
      fVar96 = auVar81._4_4_;
      fVar191 = auVar122._4_4_;
      auVar114._4_4_ = fVar191 * fVar96;
      fVar97 = auVar81._8_4_;
      fVar192 = auVar122._8_4_;
      auVar114._8_4_ = fVar192 * fVar97;
      fVar120 = auVar81._12_4_;
      fVar193 = auVar122._12_4_;
      auVar114._12_4_ = fVar193 * fVar120;
      local_19c8 = vsubps_avx(auVar114,auVar65);
      fVar181 = auVar123._0_4_;
      auVar115._0_4_ = fVar181 * fVar79;
      fVar184 = auVar123._4_4_;
      auVar115._4_4_ = fVar184 * fVar96;
      fVar185 = auVar123._8_4_;
      auVar115._8_4_ = fVar185 * fVar97;
      fVar186 = auVar123._12_4_;
      auVar115._12_4_ = fVar186 * fVar120;
      fVar121 = auVar76._0_4_;
      auVar138._0_4_ = fVar121 * fVar78;
      fVar131 = auVar76._4_4_;
      auVar138._4_4_ = fVar131 * fVar80;
      fVar154 = auVar76._8_4_;
      auVar138._8_4_ = fVar154 * fVar61;
      fVar162 = auVar76._12_4_;
      auVar138._12_4_ = fVar162 * fVar119;
      auVar75 = vsubps_avx(auVar138,auVar115);
      auVar139._0_4_ = fVar187 * fVar121;
      auVar139._4_4_ = fVar191 * fVar131;
      auVar139._8_4_ = fVar192 * fVar154;
      auVar139._12_4_ = fVar193 * fVar162;
      auVar149._0_4_ = fVar181 * fVar166;
      auVar149._4_4_ = fVar184 * fVar168;
      auVar149._8_4_ = fVar185 * fVar170;
      auVar149._12_4_ = fVar186 * fVar172;
      auVar81 = vsubps_avx(auVar149,auVar139);
      auVar76 = vsubps_avx(auVar99,*(undefined1 (*) [16])ray);
      auVar123 = vsubps_avx(auVar127,*(undefined1 (*) [16])(ray + 0x10));
      auVar122 = vsubps_avx(auVar197,*(undefined1 (*) [16])(ray + 0x20));
      fVar195 = *(float *)(ray + 0x50);
      fVar202 = *(float *)(ray + 0x54);
      fVar203 = *(float *)(ray + 0x58);
      fVar204 = *(float *)(ray + 0x5c);
      fVar155 = *(float *)(ray + 0x60);
      fVar161 = *(float *)(ray + 100);
      fVar163 = *(float *)(ray + 0x68);
      fVar165 = *(float *)(ray + 0x6c);
      fVar167 = auVar122._0_4_;
      auVar100._0_4_ = fVar167 * fVar195;
      fVar169 = auVar122._4_4_;
      auVar100._4_4_ = fVar169 * fVar202;
      fVar171 = auVar122._8_4_;
      auVar100._8_4_ = fVar171 * fVar203;
      fVar173 = auVar122._12_4_;
      auVar100._12_4_ = fVar173 * fVar204;
      fVar130 = auVar123._0_4_;
      auVar198._0_4_ = fVar130 * fVar155;
      fVar132 = auVar123._4_4_;
      auVar198._4_4_ = fVar132 * fVar161;
      fVar160 = auVar123._8_4_;
      auVar198._8_4_ = fVar160 * fVar163;
      fVar164 = auVar123._12_4_;
      auVar198._12_4_ = fVar164 * fVar165;
      auVar123 = vsubps_avx(auVar198,auVar100);
      fVar9 = *(float *)(ray + 0x40);
      fVar10 = *(float *)(ray + 0x44);
      fVar11 = *(float *)(ray + 0x48);
      fVar12 = *(float *)(ray + 0x4c);
      fVar144 = auVar76._0_4_;
      auVar199._0_4_ = fVar144 * fVar155;
      fVar151 = auVar76._4_4_;
      auVar199._4_4_ = fVar151 * fVar161;
      fVar152 = auVar76._8_4_;
      auVar199._8_4_ = fVar152 * fVar163;
      fVar153 = auVar76._12_4_;
      auVar199._12_4_ = fVar153 * fVar165;
      auVar206._0_4_ = fVar167 * fVar9;
      auVar206._4_4_ = fVar169 * fVar10;
      auVar206._8_4_ = fVar171 * fVar11;
      auVar206._12_4_ = fVar173 * fVar12;
      auVar122 = vsubps_avx(auVar206,auVar199);
      auVar207._0_4_ = fVar130 * fVar9;
      auVar207._4_4_ = fVar132 * fVar10;
      auVar207._8_4_ = fVar160 * fVar11;
      auVar207._12_4_ = fVar164 * fVar12;
      auVar140._0_4_ = fVar195 * fVar144;
      auVar140._4_4_ = fVar202 * fVar151;
      auVar140._8_4_ = fVar203 * fVar152;
      auVar140._12_4_ = fVar204 * fVar153;
      auVar109 = vsubps_avx(auVar140,auVar207);
      auVar177._0_4_ = local_19c8._0_4_ * fVar9 + fVar195 * auVar75._0_4_ + auVar81._0_4_ * fVar155;
      auVar177._4_4_ = local_19c8._4_4_ * fVar10 + fVar202 * auVar75._4_4_ + auVar81._4_4_ * fVar161
      ;
      auVar177._8_4_ = local_19c8._8_4_ * fVar11 + fVar203 * auVar75._8_4_ + auVar81._8_4_ * fVar163
      ;
      auVar177._12_4_ =
           local_19c8._12_4_ * fVar12 + fVar204 * auVar75._12_4_ + auVar81._12_4_ * fVar165;
      auVar85._8_4_ = 0x80000000;
      auVar85._0_8_ = 0x8000000080000000;
      auVar85._12_4_ = 0x80000000;
      auVar76 = vandps_avx(auVar177,auVar85);
      uVar44 = auVar76._0_4_;
      auVar86._0_4_ =
           (float)(uVar44 ^ (uint)(fVar181 * auVar123._0_4_ +
                                  fVar187 * auVar122._0_4_ + auVar109._0_4_ * fVar78));
      uVar179 = auVar76._4_4_;
      auVar86._4_4_ =
           (float)(uVar179 ^
                  (uint)(fVar184 * auVar123._4_4_ +
                        fVar191 * auVar122._4_4_ + auVar109._4_4_ * fVar80));
      uVar180 = auVar76._8_4_;
      auVar86._8_4_ =
           (float)(uVar180 ^
                  (uint)(fVar185 * auVar123._8_4_ +
                        fVar192 * auVar122._8_4_ + auVar109._8_4_ * fVar61));
      uVar194 = auVar76._12_4_;
      auVar86._12_4_ =
           (float)(uVar194 ^
                  (uint)(fVar186 * auVar123._12_4_ +
                        fVar193 * auVar122._12_4_ + auVar109._12_4_ * fVar119));
      auVar76 = vcmpps_avx(auVar86,_DAT_01f45a50,5);
      auVar133 = auVar83 & auVar76;
      if ((((auVar133 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar133 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar133 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          auVar133[0xf] < '\0') {
        auVar76 = vandps_avx(auVar76,auVar83);
        auVar104._0_4_ =
             (float)(uVar44 ^ (uint)(auVar123._0_4_ * fVar121 +
                                    auVar122._0_4_ * fVar166 + fVar79 * auVar109._0_4_));
        auVar104._4_4_ =
             (float)(uVar179 ^
                    (uint)(auVar123._4_4_ * fVar131 +
                          auVar122._4_4_ * fVar168 + fVar96 * auVar109._4_4_));
        auVar104._8_4_ =
             (float)(uVar180 ^
                    (uint)(auVar123._8_4_ * fVar154 +
                          auVar122._8_4_ * fVar170 + fVar97 * auVar109._8_4_));
        auVar104._12_4_ =
             (float)(uVar194 ^
                    (uint)(auVar123._12_4_ * fVar162 +
                          auVar122._12_4_ * fVar172 + fVar120 * auVar109._12_4_));
        auVar123 = vcmpps_avx(auVar104,_DAT_01f45a50,5);
        auVar122 = auVar76 & auVar123;
        if ((((auVar122 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar122 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar122 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar122[0xf] < '\0') {
          auVar67._8_4_ = 0x7fffffff;
          auVar67._0_8_ = 0x7fffffff7fffffff;
          auVar67._12_4_ = 0x7fffffff;
          auVar122 = vandps_avx(auVar177,auVar67);
          auVar76 = vandps_avx(auVar123,auVar76);
          auVar123 = vsubps_avx(auVar122,auVar86);
          auVar123 = vcmpps_avx(auVar123,auVar104,5);
          auVar109 = auVar76 & auVar123;
          if ((((auVar109 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar109 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar109 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar109[0xf] < '\0') {
            auVar76 = vandps_avx(auVar123,auVar76);
            auVar129._0_4_ =
                 uVar44 ^ (uint)(local_19c8._0_4_ * fVar144 +
                                auVar75._0_4_ * fVar130 + fVar167 * auVar81._0_4_);
            auVar129._4_4_ =
                 uVar179 ^ (uint)(local_19c8._4_4_ * fVar151 +
                                 auVar75._4_4_ * fVar132 + fVar169 * auVar81._4_4_);
            auVar129._8_4_ =
                 uVar180 ^ (uint)(local_19c8._8_4_ * fVar152 +
                                 auVar75._8_4_ * fVar160 + fVar171 * auVar81._8_4_);
            auVar129._12_4_ =
                 uVar194 ^ (uint)(local_19c8._12_4_ * fVar153 +
                                 auVar75._12_4_ * fVar164 + fVar173 * auVar81._12_4_);
            fVar78 = auVar122._0_4_;
            auVar71._0_4_ = fVar78 * *(float *)(ray + 0x30);
            fVar79 = auVar122._4_4_;
            auVar71._4_4_ = fVar79 * *(float *)(ray + 0x34);
            fVar80 = auVar122._8_4_;
            auVar71._8_4_ = fVar80 * *(float *)(ray + 0x38);
            fVar96 = auVar122._12_4_;
            auVar71._12_4_ = fVar96 * *(float *)(ray + 0x3c);
            auVar117._0_4_ = fVar78 * *(float *)(ray + 0x80);
            auVar117._4_4_ = fVar79 * *(float *)(ray + 0x84);
            auVar117._8_4_ = fVar80 * *(float *)(ray + 0x88);
            auVar117._12_4_ = fVar96 * *(float *)(ray + 0x8c);
            auVar123 = vcmpps_avx(auVar71,auVar129,1);
            auVar109 = vcmpps_avx(auVar129,auVar117,2);
            auVar123 = vandps_avx(auVar109,auVar123);
            auVar109 = auVar76 & auVar123;
            if ((((auVar109 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar109 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar109 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar109[0xf] < '\0') {
              auVar76 = vandps_avx(auVar76,auVar123);
              auVar123 = vcmpps_avx(auVar177,_DAT_01f45a50,4);
              auVar109 = auVar76 & auVar123;
              if ((((auVar109 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar109 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar109 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar109[0xf] < '\0') {
                auVar76 = vandps_avx(auVar123,auVar76);
                uVar44 = pGVar6->mask;
                auVar72._4_4_ = uVar44;
                auVar72._0_4_ = uVar44;
                auVar72._8_4_ = uVar44;
                auVar72._12_4_ = uVar44;
                auVar123 = vandps_avx(auVar72,*(undefined1 (*) [16])(ray + 0x90));
                auVar123 = vpcmpeqd_avx(auVar123,_DAT_01f45a50);
                auVar109 = auVar76 & ~auVar123;
                if ((((auVar109 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar109 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar109 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar109[0xf] < '\0') {
                  local_1a08 = vandnps_avx(auVar123,auVar76);
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar76 = vrcpps_avx(auVar122);
                    fVar61 = auVar76._0_4_;
                    auVar118._0_4_ = fVar78 * fVar61;
                    fVar78 = auVar76._4_4_;
                    auVar118._4_4_ = fVar79 * fVar78;
                    fVar79 = auVar76._8_4_;
                    auVar118._8_4_ = fVar80 * fVar79;
                    fVar80 = auVar76._12_4_;
                    auVar118._12_4_ = fVar96 * fVar80;
                    auVar143._8_4_ = 0x3f800000;
                    auVar143._0_8_ = 0x3f8000003f800000;
                    auVar143._12_4_ = 0x3f800000;
                    auVar76 = vsubps_avx(auVar143,auVar118);
                    fVar61 = fVar61 + fVar61 * auVar76._0_4_;
                    fVar78 = fVar78 + fVar78 * auVar76._4_4_;
                    fVar79 = fVar79 + fVar79 * auVar76._8_4_;
                    fVar80 = fVar80 + fVar80 * auVar76._12_4_;
                    auVar93._0_4_ = fVar61 * auVar86._0_4_;
                    auVar93._4_4_ = fVar78 * auVar86._4_4_;
                    auVar93._8_4_ = fVar79 * auVar86._8_4_;
                    auVar93._12_4_ = fVar80 * auVar86._12_4_;
                    auVar76 = vminps_avx(auVar93,auVar143);
                    auVar74._0_4_ = fVar61 * auVar104._0_4_;
                    auVar74._4_4_ = fVar78 * auVar104._4_4_;
                    auVar74._8_4_ = fVar79 * auVar104._8_4_;
                    auVar74._12_4_ = fVar80 * auVar104._12_4_;
                    auVar123 = vminps_avx(auVar74,auVar143);
                    auVar122 = vsubps_avx(auVar143,auVar76);
                    auVar109 = vsubps_avx(auVar143,auVar123);
                    auVar20._8_8_ = uVar22;
                    auVar20._0_8_ = uVar21;
                    vblendvps_avx(auVar76,auVar122,auVar20);
                    vblendvps_avx(auVar123,auVar109,auVar20);
                    p1.field_0._0_8_ = &itime;
                    p1.field_0._8_8_ = &t;
                    p1.field_0._16_8_ = &v;
                    p1.field_0._24_8_ = &u;
                    p0.field_0._0_16_ = local_19c8;
                    p0.field_0._16_16_ = auVar75;
                    p0.field_0._32_16_ = auVar81;
                    std::
                    _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                    ::
                    _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                              ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                *)&p1,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                       *)&p0);
                    auVar76 = vshufps_avx(ZEXT416(uVar178),ZEXT416(uVar178),0);
                    vshufps_avx(ZEXT416(local_19cc),ZEXT416(local_19cc),0);
                    p0.field_0.field_0.x.field_0 = (vfloat_impl<4>)(vfloat_impl<4>)itime.field_0;
                    p0.field_0._24_8_ = uStack_18a0;
                    p0.field_0._16_8_ = local_18a8;
                    p0.field_0._40_8_ = uStack_1890;
                    p0.field_0._32_8_ = uStack_1898;
                    vcmpps_avx(ZEXT1632(auVar76),ZEXT1632(auVar76),0xf);
                    local_19c8 = *(undefined1 (*) [16])(ray + 0x80);
                    auVar76 = vblendvps_avx(local_19c8,(undefined1  [16])t.field_0,local_1a08);
                    *(undefined1 (*) [16])(ray + 0x80) = auVar76;
                    p1.field_0._0_8_ = local_19e8;
                    p1.field_0._8_8_ = pGVar6->userPtr;
                    p1.field_0._16_8_ = context->user;
                    p1.field_0._32_8_ = &p0;
                    p1.field_0._40_4_ = 4;
                    p1.field_0._24_8_ = ray;
                    local_19e8 = local_1a08;
                    if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar6->occlusionFilterN)((RTCFilterFunctionNArguments *)&p1);
                    }
                    if (local_19e8 == (undefined1  [16])0x0) {
                      auVar76 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar76 = auVar76 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var7 = context->args->filter;
                      if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var7)((RTCFilterFunctionNArguments *)&p1);
                      }
                      auVar75 = vpcmpeqd_avx(local_19e8,_DAT_01f45a50);
                      auVar76 = auVar75 ^ _DAT_01f46b70;
                      auVar107._8_4_ = 0xff800000;
                      auVar107._0_8_ = 0xff800000ff800000;
                      auVar107._12_4_ = 0xff800000;
                      auVar75 = vblendvps_avx(auVar107,*(undefined1 (*) [16])
                                                        (p1.field_0._24_8_ + 0x80),auVar75);
                      *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar75;
                    }
                    auVar76 = vpslld_avx(auVar76,0x1f);
                    local_1a08 = vpsrad_avx(auVar76,0x1f);
                    auVar76 = vblendvps_avx(local_19c8,*(undefined1 (*) [16])local_19d8,auVar76);
                    *(undefined1 (*) [16])local_19d8 = auVar76;
                  }
                  auVar83 = vandnps_avx(local_1a08,auVar83);
                }
              }
            }
          }
        }
      }
      if ((((auVar83 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar83 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar83 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar83[0xf])
      break;
      auVar14._4_4_ = fStack_1834;
      auVar14._0_4_ = local_1838;
      auVar14._8_4_ = fStack_1830;
      auVar14._12_4_ = fStack_182c;
      auVar76 = vsubps_avx(auVar14,auVar176);
      auVar13._4_4_ = fStack_18e4;
      auVar13._0_4_ = local_18e8;
      auVar13._8_4_ = fStack_18e0;
      auVar13._12_4_ = fStack_18dc;
      auVar75 = vsubps_avx(auVar13,auVar148);
      auVar15._4_4_ = fStack_1824;
      auVar15._0_4_ = local_1828;
      auVar15._8_4_ = fStack_1820;
      auVar15._12_4_ = fStack_181c;
      auVar81 = vsubps_avx(auVar15,auVar64);
      auVar123 = vsubps_avx(auVar205,auVar14);
      auVar122 = vsubps_avx(auVar84,auVar13);
      auVar109 = vsubps_avx(auVar159,auVar15);
      fVar78 = auVar75._0_4_;
      fVar187 = auVar109._0_4_;
      auVar66._0_4_ = fVar187 * fVar78;
      fVar96 = auVar75._4_4_;
      fVar191 = auVar109._4_4_;
      auVar66._4_4_ = fVar191 * fVar96;
      fVar119 = auVar75._8_4_;
      fVar192 = auVar109._8_4_;
      auVar66._8_4_ = fVar192 * fVar119;
      fVar202 = auVar75._12_4_;
      fVar193 = auVar109._12_4_;
      auVar66._12_4_ = fVar193 * fVar202;
      fVar79 = auVar122._0_4_;
      fVar170 = auVar81._0_4_;
      auVar87._0_4_ = fVar170 * fVar79;
      fVar61 = auVar122._4_4_;
      fVar171 = auVar81._4_4_;
      auVar87._4_4_ = fVar171 * fVar61;
      fVar120 = auVar122._8_4_;
      fVar172 = auVar81._8_4_;
      auVar87._8_4_ = fVar172 * fVar120;
      fVar203 = auVar122._12_4_;
      fVar173 = auVar81._12_4_;
      auVar87._12_4_ = fVar173 * fVar203;
      auVar75 = vsubps_avx(auVar87,auVar66);
      fVar80 = auVar123._0_4_;
      auVar88._0_4_ = fVar170 * fVar80;
      fVar97 = auVar123._4_4_;
      auVar88._4_4_ = fVar171 * fVar97;
      fVar195 = auVar123._8_4_;
      auVar88._8_4_ = fVar172 * fVar195;
      fVar204 = auVar123._12_4_;
      auVar88._12_4_ = fVar173 * fVar204;
      fVar181 = auVar76._0_4_;
      auVar101._0_4_ = fVar181 * fVar187;
      fVar184 = auVar76._4_4_;
      auVar101._4_4_ = fVar184 * fVar191;
      fVar185 = auVar76._8_4_;
      auVar101._8_4_ = fVar185 * fVar192;
      fVar186 = auVar76._12_4_;
      auVar101._12_4_ = fVar186 * fVar193;
      auVar81 = vsubps_avx(auVar101,auVar88);
      auVar102._0_4_ = fVar181 * fVar79;
      auVar102._4_4_ = fVar184 * fVar61;
      auVar102._8_4_ = fVar185 * fVar120;
      auVar102._12_4_ = fVar186 * fVar203;
      auVar141._0_4_ = fVar78 * fVar80;
      auVar141._4_4_ = fVar96 * fVar97;
      auVar141._8_4_ = fVar119 * fVar195;
      auVar141._12_4_ = fVar202 * fVar204;
      local_19c8 = vsubps_avx(auVar141,auVar102);
      auVar76 = vsubps_avx(auVar14,*(undefined1 (*) [16])ray);
      auVar123 = vsubps_avx(auVar13,*(undefined1 (*) [16])(ray + 0x10));
      auVar122 = vsubps_avx(auVar15,*(undefined1 (*) [16])(ray + 0x20));
      fVar155 = *(float *)(ray + 0x50);
      fVar161 = *(float *)(ray + 0x54);
      fVar163 = *(float *)(ray + 0x58);
      fVar165 = *(float *)(ray + 0x5c);
      fVar9 = *(float *)(ray + 0x60);
      fVar10 = *(float *)(ray + 100);
      fVar11 = *(float *)(ray + 0x68);
      fVar12 = *(float *)(ray + 0x6c);
      fVar166 = auVar122._0_4_;
      auVar183._0_4_ = fVar166 * fVar155;
      fVar167 = auVar122._4_4_;
      auVar183._4_4_ = fVar167 * fVar161;
      fVar168 = auVar122._8_4_;
      auVar183._8_4_ = fVar168 * fVar163;
      fVar169 = auVar122._12_4_;
      auVar183._12_4_ = fVar169 * fVar165;
      fVar154 = auVar123._0_4_;
      auVar189._0_4_ = fVar154 * fVar9;
      fVar160 = auVar123._4_4_;
      auVar189._4_4_ = fVar160 * fVar10;
      fVar162 = auVar123._8_4_;
      auVar189._8_4_ = fVar162 * fVar11;
      fVar164 = auVar123._12_4_;
      auVar189._12_4_ = fVar164 * fVar12;
      auVar123 = vsubps_avx(auVar189,auVar183);
      fVar144 = *(float *)(ray + 0x40);
      fVar151 = *(float *)(ray + 0x44);
      fVar152 = *(float *)(ray + 0x48);
      fVar153 = *(float *)(ray + 0x4c);
      fVar121 = auVar76._0_4_;
      auVar190._0_4_ = fVar121 * fVar9;
      fVar130 = auVar76._4_4_;
      auVar190._4_4_ = fVar130 * fVar10;
      fVar131 = auVar76._8_4_;
      auVar190._8_4_ = fVar131 * fVar11;
      fVar132 = auVar76._12_4_;
      auVar190._12_4_ = fVar132 * fVar12;
      auVar200._0_4_ = fVar166 * fVar144;
      auVar200._4_4_ = fVar167 * fVar151;
      auVar200._8_4_ = fVar168 * fVar152;
      auVar200._12_4_ = fVar169 * fVar153;
      auVar122 = vsubps_avx(auVar200,auVar190);
      auVar201._0_4_ = fVar154 * fVar144;
      auVar201._4_4_ = fVar160 * fVar151;
      auVar201._8_4_ = fVar162 * fVar152;
      auVar201._12_4_ = fVar164 * fVar153;
      auVar103._0_4_ = fVar155 * fVar121;
      auVar103._4_4_ = fVar161 * fVar130;
      auVar103._8_4_ = fVar163 * fVar131;
      auVar103._12_4_ = fVar165 * fVar132;
      auVar109 = vsubps_avx(auVar103,auVar201);
      auVar175._0_4_ = auVar75._0_4_ * fVar144 + fVar155 * auVar81._0_4_ + local_19c8._0_4_ * fVar9;
      auVar175._4_4_ = auVar75._4_4_ * fVar151 + fVar161 * auVar81._4_4_ + local_19c8._4_4_ * fVar10
      ;
      auVar175._8_4_ = auVar75._8_4_ * fVar152 + fVar163 * auVar81._8_4_ + local_19c8._8_4_ * fVar11
      ;
      auVar175._12_4_ =
           auVar75._12_4_ * fVar153 + fVar165 * auVar81._12_4_ + local_19c8._12_4_ * fVar12;
      auVar89._8_4_ = 0x80000000;
      auVar89._0_8_ = 0x8000000080000000;
      auVar89._12_4_ = 0x80000000;
      auVar76 = vandps_avx(auVar175,auVar89);
      uVar44 = auVar76._0_4_;
      auVar116._0_4_ =
           (float)(uVar44 ^ (uint)(auVar123._0_4_ * fVar80 +
                                  fVar79 * auVar122._0_4_ + fVar187 * auVar109._0_4_));
      uVar178 = auVar76._4_4_;
      auVar116._4_4_ =
           (float)(uVar178 ^
                  (uint)(auVar123._4_4_ * fVar97 +
                        fVar61 * auVar122._4_4_ + fVar191 * auVar109._4_4_));
      uVar179 = auVar76._8_4_;
      auVar116._8_4_ =
           (float)(uVar179 ^
                  (uint)(auVar123._8_4_ * fVar195 +
                        fVar120 * auVar122._8_4_ + fVar192 * auVar109._8_4_));
      uVar180 = auVar76._12_4_;
      auVar116._12_4_ =
           (float)(uVar180 ^
                  (uint)(auVar123._12_4_ * fVar204 +
                        fVar203 * auVar122._12_4_ + fVar193 * auVar109._12_4_));
      auVar95 = ZEXT1664(auVar83);
      auVar76 = vcmpps_avx(auVar116,_DAT_01f45a50,5);
      auVar133 = auVar83 & auVar76;
      if ((((auVar133 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar133 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar133 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          auVar133[0xf] < '\0') {
        auVar76 = vandps_avx(auVar76,auVar83);
        auVar128._0_4_ =
             (float)(uVar44 ^ (uint)(auVar123._0_4_ * fVar181 +
                                    auVar122._0_4_ * fVar78 + fVar170 * auVar109._0_4_));
        auVar128._4_4_ =
             (float)(uVar178 ^
                    (uint)(auVar123._4_4_ * fVar184 +
                          auVar122._4_4_ * fVar96 + fVar171 * auVar109._4_4_));
        auVar128._8_4_ =
             (float)(uVar179 ^
                    (uint)(auVar123._8_4_ * fVar185 +
                          auVar122._8_4_ * fVar119 + fVar172 * auVar109._8_4_));
        auVar128._12_4_ =
             (float)(uVar180 ^
                    (uint)(auVar123._12_4_ * fVar186 +
                          auVar122._12_4_ * fVar202 + fVar173 * auVar109._12_4_));
        auVar123 = vcmpps_avx(auVar128,_DAT_01f45a50,5);
        auVar122 = auVar76 & auVar123;
        if ((((auVar122 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar122 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar122 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar122[0xf] < '\0') {
          auVar68._8_4_ = 0x7fffffff;
          auVar68._0_8_ = 0x7fffffff7fffffff;
          auVar68._12_4_ = 0x7fffffff;
          auVar122 = vandps_avx(auVar175,auVar68);
          auVar76 = vandps_avx(auVar123,auVar76);
          auVar123 = vsubps_avx(auVar122,auVar116);
          auVar123 = vcmpps_avx(auVar123,auVar128,5);
          auVar109 = auVar76 & auVar123;
          if ((((auVar109 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar109 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar109 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar109[0xf] < '\0') {
            auVar76 = vandps_avx(auVar123,auVar76);
            auVar142._0_4_ =
                 uVar44 ^ (uint)(auVar75._0_4_ * fVar121 +
                                fVar154 * auVar81._0_4_ + fVar166 * local_19c8._0_4_);
            auVar142._4_4_ =
                 uVar178 ^ (uint)(auVar75._4_4_ * fVar130 +
                                 fVar160 * auVar81._4_4_ + fVar167 * local_19c8._4_4_);
            auVar142._8_4_ =
                 uVar179 ^ (uint)(auVar75._8_4_ * fVar131 +
                                 fVar162 * auVar81._8_4_ + fVar168 * local_19c8._8_4_);
            auVar142._12_4_ =
                 uVar180 ^ (uint)(auVar75._12_4_ * fVar132 +
                                 fVar164 * auVar81._12_4_ + fVar169 * local_19c8._12_4_);
            fVar78 = auVar122._0_4_;
            auVar69._0_4_ = fVar78 * *(float *)(ray + 0x30);
            fVar79 = auVar122._4_4_;
            auVar69._4_4_ = fVar79 * *(float *)(ray + 0x34);
            fVar80 = auVar122._8_4_;
            auVar69._8_4_ = fVar80 * *(float *)(ray + 0x38);
            fVar96 = auVar122._12_4_;
            auVar69._12_4_ = fVar96 * *(float *)(ray + 0x3c);
            auVar91._0_4_ = fVar78 * *(float *)(ray + 0x80);
            auVar91._4_4_ = fVar79 * *(float *)(ray + 0x84);
            auVar91._8_4_ = fVar80 * *(float *)(ray + 0x88);
            auVar91._12_4_ = fVar96 * *(float *)(ray + 0x8c);
            auVar123 = vcmpps_avx(auVar69,auVar142,1);
            auVar109 = vcmpps_avx(auVar142,auVar91,2);
            auVar123 = vandps_avx(auVar109,auVar123);
            auVar109 = auVar76 & auVar123;
            if ((((auVar109 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar109 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar109 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar109[0xf] < '\0') {
              auVar76 = vandps_avx(auVar76,auVar123);
              auVar123 = vcmpps_avx(auVar175,_DAT_01f45a50,4);
              auVar109 = auVar76 & auVar123;
              if ((((auVar109 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar109 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar109 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar109[0xf] < '\0') {
                auVar76 = vandps_avx(auVar123,auVar76);
                uVar178 = *(uint *)(lVar55 + 0x40 + lVar53 * 4);
                pGVar6 = (context->scene->geometries).items[uVar178].ptr;
                uVar44 = pGVar6->mask;
                auVar70._4_4_ = uVar44;
                auVar70._0_4_ = uVar44;
                auVar70._8_4_ = uVar44;
                auVar70._12_4_ = uVar44;
                auVar123 = vandps_avx(auVar70,*(undefined1 (*) [16])(ray + 0x90));
                auVar123 = vpcmpeqd_avx(auVar123,_DAT_01f45a50);
                auVar109 = auVar76 & ~auVar123;
                if ((((auVar109 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar109 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar109 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar109[0xf] < '\0') {
                  uVar44 = *(uint *)(lVar55 + 0x50 + lVar53 * 4);
                  local_1aa8 = vandnps_avx(auVar123,auVar76);
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar76 = vrcpps_avx(auVar122);
                    fVar61 = auVar76._0_4_;
                    auVar92._0_4_ = fVar78 * fVar61;
                    fVar78 = auVar76._4_4_;
                    auVar92._4_4_ = fVar79 * fVar78;
                    fVar79 = auVar76._8_4_;
                    auVar92._8_4_ = fVar80 * fVar79;
                    fVar80 = auVar76._12_4_;
                    auVar92._12_4_ = fVar96 * fVar80;
                    auVar150._8_4_ = 0x3f800000;
                    auVar150._0_8_ = 0x3f8000003f800000;
                    auVar150._12_4_ = 0x3f800000;
                    auVar76 = vsubps_avx(auVar150,auVar92);
                    fVar61 = fVar61 + fVar61 * auVar76._0_4_;
                    fVar78 = fVar78 + fVar78 * auVar76._4_4_;
                    fVar79 = fVar79 + fVar79 * auVar76._8_4_;
                    fVar80 = fVar80 + fVar80 * auVar76._12_4_;
                    auVar105._0_4_ = fVar61 * auVar116._0_4_;
                    auVar105._4_4_ = fVar78 * auVar116._4_4_;
                    auVar105._8_4_ = fVar79 * auVar116._8_4_;
                    auVar105._12_4_ = fVar80 * auVar116._12_4_;
                    auVar76 = vminps_avx(auVar105,auVar150);
                    auVar73._0_4_ = fVar61 * auVar128._0_4_;
                    auVar73._4_4_ = fVar78 * auVar128._4_4_;
                    auVar73._8_4_ = fVar79 * auVar128._8_4_;
                    auVar73._12_4_ = fVar80 * auVar128._12_4_;
                    auVar123 = vminps_avx(auVar73,auVar150);
                    auVar122 = vsubps_avx(auVar150,auVar76);
                    auVar109 = vsubps_avx(auVar150,auVar123);
                    auVar19._8_8_ = uVar24;
                    auVar19._0_8_ = uVar23;
                    vblendvps_avx(auVar76,auVar122,auVar19);
                    vblendvps_avx(auVar123,auVar109,auVar19);
                    p1.field_0._0_8_ = &itime;
                    p1.field_0._8_8_ = &t;
                    p1.field_0._16_8_ = &v;
                    p1.field_0._24_8_ = &u;
                    p0.field_0._0_16_ = auVar75;
                    p0.field_0._16_16_ = auVar81;
                    p0.field_0._32_16_ = local_19c8;
                    std::
                    _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                    ::
                    _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                              ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                *)&p1,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                       *)&p0);
                    auVar76 = vshufps_avx(ZEXT416(uVar178),ZEXT416(uVar178),0);
                    auVar75 = ZEXT416(uVar44);
                    vshufps_avx(auVar75,auVar75,0);
                    p0.field_0.field_0.x.field_0 = (vfloat_impl<4>)(vfloat_impl<4>)itime.field_0;
                    p0.field_0._24_8_ = uStack_18a0;
                    p0.field_0._16_8_ = local_18a8;
                    p0.field_0._40_8_ = uStack_1890;
                    p0.field_0._32_8_ = uStack_1898;
                    vcmpps_avx(ZEXT1632(auVar76),ZEXT1632(auVar76),0xf);
                    auVar76 = *(undefined1 (*) [16])(ray + 0x80);
                    auVar75 = vblendvps_avx(auVar76,(undefined1  [16])t.field_0,local_1aa8);
                    *(undefined1 (*) [16])(ray + 0x80) = auVar75;
                    p1.field_0._0_8_ = local_19e8;
                    p1.field_0._8_8_ = pGVar6->userPtr;
                    p1.field_0._16_8_ = context->user;
                    p1.field_0._32_8_ = &p0;
                    p1.field_0._40_4_ = 4;
                    p1.field_0._24_8_ = ray;
                    local_19e8 = local_1aa8;
                    if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar6->occlusionFilterN)((RTCFilterFunctionNArguments *)&p1);
                    }
                    if (local_19e8 == (undefined1  [16])0x0) {
                      auVar75 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar75 = auVar75 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var7 = context->args->filter;
                      if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var7)((RTCFilterFunctionNArguments *)&p1);
                      }
                      auVar81 = vpcmpeqd_avx(local_19e8,_DAT_01f45a50);
                      auVar75 = auVar81 ^ _DAT_01f46b70;
                      auVar106._8_4_ = 0xff800000;
                      auVar106._0_8_ = 0xff800000ff800000;
                      auVar106._12_4_ = 0xff800000;
                      auVar81 = vblendvps_avx(auVar106,*(undefined1 (*) [16])
                                                        (p1.field_0._24_8_ + 0x80),auVar81);
                      *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar81;
                    }
                    auVar75 = vpslld_avx(auVar75,0x1f);
                    local_1aa8 = vpsrad_avx(auVar75,0x1f);
                    auVar76 = vblendvps_avx(auVar76,*(undefined1 (*) [16])local_19d8,auVar75);
                    *(undefined1 (*) [16])local_19d8 = auVar76;
                  }
                  auVar83 = vandnps_avx(local_1aa8,auVar83);
                }
              }
            }
            auVar95 = ZEXT1664(auVar83);
            goto LAB_00ec3cb8;
          }
        }
        auVar95 = ZEXT1664(auVar83);
      }
LAB_00ec3cb8:
      lVar53 = lVar53 + 1;
      auVar83 = auVar95._0_16_;
    } while ((((auVar83 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              (auVar83 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar83 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             auVar95[0xf] < '\0');
    auVar95 = ZEXT1664(local_1928);
    auVar75 = vandps_avx(auVar83,local_1928);
    lVar52 = lVar52 + 1;
    auVar83 = local_1928 & auVar83;
    auVar76 = local_1928;
    local_1928 = auVar75;
  } while ((((auVar83 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
            (auVar83 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar83 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           auVar83[0xf] < '\0');
  auVar76 = vpcmpeqd_avx(auVar76,auVar76);
  auVar77._0_4_ = local_1928._0_4_ ^ auVar76._0_4_;
  auVar77._4_4_ = local_1928._4_4_ ^ auVar76._4_4_;
  auVar77._8_4_ = local_1928._8_4_ ^ auVar76._8_4_;
  auVar77._12_4_ = local_1928._12_4_ ^ auVar76._12_4_;
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx(auVar77,(undefined1  [16])vVar42.field_0);
  auVar76 = auVar76 & ~(undefined1  [16])terminated.field_0;
  if ((((auVar76 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar76 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar76 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar76[0xf])
  goto LAB_00ec4b1b;
  auVar108._8_4_ = 0xff800000;
  auVar108._0_8_ = 0xff800000ff800000;
  auVar108._12_4_ = 0xff800000;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar108,
                     (undefined1  [16])terminated.field_0);
  goto LAB_00ec3478;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }